

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MADPComponentDiscreteActions.cpp
# Opt level: O1

Index __thiscall
MADPComponentDiscreteActions::GetActionIndexByName
          (MADPComponentDiscreteActions *this,string *s,Index agentI)

{
  pointer pvVar1;
  pointer pAVar2;
  pointer pcVar3;
  size_t __n;
  int iVar4;
  ostream *poVar5;
  undefined8 *puVar6;
  E *this_00;
  ulong uVar7;
  Index unaff_EBP;
  pointer pAVar8;
  bool bVar9;
  stringstream ss;
  allocator<char> local_1e1;
  ulong local_1e0;
  char *local_1d8;
  long *local_1b8;
  size_t local_1b0;
  long local_1a8 [47];
  
  if (this->_m_initialized == false) {
    this_00 = (E *)__cxa_allocate_exception(0x28);
    E::E(this_00,"MADPComponentDiscreteActions::GetActionIndexByName - not initialized!");
    __cxa_throw(this_00,&E::typeinfo,E::~E);
  }
  local_1e0 = (ulong)agentI;
  pvVar1 = (this->_m_actionVecs).
           super__Vector_base<std::vector<ActionDiscrete,_std::allocator<ActionDiscrete>_>,_std::allocator<std::vector<ActionDiscrete,_std::allocator<ActionDiscrete>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar7 = ((long)(this->_m_actionVecs).
                 super__Vector_base<std::vector<ActionDiscrete,_std::allocator<ActionDiscrete>_>,_std::allocator<std::vector<ActionDiscrete,_std::allocator<ActionDiscrete>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar1 >> 3) *
          -0x5555555555555555;
  if (local_1e0 <= uVar7 && uVar7 - local_1e0 != 0) {
    pAVar8 = pvVar1[local_1e0].super__Vector_base<ActionDiscrete,_std::allocator<ActionDiscrete>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pAVar2 = *(pointer *)
              ((long)&pvVar1[local_1e0].
                      super__Vector_base<ActionDiscrete,_std::allocator<ActionDiscrete>_>._M_impl.
                      super__Vector_impl_data + 8);
    do {
      if (pAVar8 == pAVar2) {
        std::__cxx11::stringstream::stringstream((stringstream *)&local_1b8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"GetActionIndexByName - action \"",0x1f);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_1a8,(s->_M_dataplus)._M_p,s->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\" of agent ",0xb);
        poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5," not found.",0xb);
        std::endl<char,std::char_traits<char>>(poVar5);
        puVar6 = (undefined8 *)__cxa_allocate_exception(0x28);
        std::__cxx11::stringbuf::str();
        *puVar6 = &PTR__E_0059bd80;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)(puVar6 + 1),local_1d8,&local_1e1);
        __cxa_throw(puVar6,&E::typeinfo,E::~E);
      }
      pcVar3 = (pAVar8->super_Action).super_NamedDescribedEntity._m_name._M_dataplus._M_p;
      local_1b8 = local_1a8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1b8,pcVar3,
                 pcVar3 + *(size_type *)
                           ((long)&(pAVar8->super_Action).super_NamedDescribedEntity._m_name + 8));
      __n = s->_M_string_length;
      if (__n == local_1b0) {
        if (__n == 0) {
          bVar9 = true;
        }
        else {
          iVar4 = bcmp((s->_M_dataplus)._M_p,local_1b8,__n);
          bVar9 = iVar4 == 0;
        }
      }
      else {
        bVar9 = false;
      }
      if (bVar9) {
        unaff_EBP = (pAVar8->super_DiscreteEntity)._m_index;
      }
      else {
        pAVar8 = pAVar8 + 1;
      }
      if (local_1b8 != local_1a8) {
        operator_delete(local_1b8,local_1a8[0] + 1);
      }
    } while (!bVar9);
    return unaff_EBP;
  }
  std::__cxx11::stringstream::stringstream((stringstream *)&local_1b8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"GetActionIndexByName -  Agent index (",0x25);
  poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar5,") out of bounds! (_m_actionVecs contains actions for ",0x35);
  poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5," agents...)\n",0xc);
  puVar6 = (undefined8 *)__cxa_allocate_exception(0x28);
  *puVar6 = &PTR__E_0059bd80;
  std::__cxx11::stringbuf::str();
  __cxa_throw(puVar6,&E::typeinfo,E::~E);
}

Assistant:

Index MADPComponentDiscreteActions::GetActionIndexByName(const string &s,
                                                         Index agentI) const
{
    if(!_m_initialized)
        throw E("MADPComponentDiscreteActions::GetActionIndexByName - not initialized!");

    if(agentI >= _m_actionVecs.size())
    {
        stringstream ss;
        ss << "GetActionIndexByName -  Agent index ("<<
            agentI<<") out of bounds! (_m_actionVecs contains actions for "<<
            _m_actionVecs.size() << " agents...)\n";
        throw E(ss);
    }
    vector<ActionDiscrete>::const_iterator it = _m_actionVecs[agentI].begin();
    vector<ActionDiscrete>::const_iterator last = _m_actionVecs[agentI].end();
    while(it != last)
    {
        string s2 = (*it).GetName();
        if(s == s2)
        //if(strcmp(s,s2) == 0)//match
            return( (*it).GetIndex() );
        it++;
    }
    //not found
    stringstream ss;
    ss << "GetActionIndexByName - action \"" << s << "\" of agent " << agentI <<
    " not found." << endl;
    throw E(ss.str().c_str());

}